

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MessageOperators.cpp
# Opt level: O2

unique_ptr<helics::Message,_std::default_delete<helics::Message>_> __thiscall
helics::MessageConditionalOperator::process
          (MessageConditionalOperator *this,
          unique_ptr<helics::Message,_std::default_delete<helics::Message>_> *message)

{
  bool bVar1;
  MessageConditionalOperator *in_RDX;
  MessageConditionalOperator *pMVar2;
  
  if ((message[3]._M_t.super___uniq_ptr_impl<helics::Message,_std::default_delete<helics::Message>_>
       ._M_t.super__Tuple_impl<0UL,_helics::Message_*,_std::default_delete<helics::Message>_>.
       super__Head_base<0UL,_helics::Message_*,_false>._M_head_impl == (Message *)0x0) ||
     (bVar1 = std::function<bool_(const_helics::Message_*)>::operator()
                        ((function<bool_(const_helics::Message_*)> *)(message + 1),
                         (Message *)(in_RDX->super_FilterOperator)._vptr_FilterOperator),
     pMVar2 = this, bVar1)) {
    (this->super_FilterOperator)._vptr_FilterOperator =
         (in_RDX->super_FilterOperator)._vptr_FilterOperator;
    pMVar2 = in_RDX;
  }
  (pMVar2->super_FilterOperator)._vptr_FilterOperator = (_func_int **)0x0;
  return (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)
         (__uniq_ptr_data<helics::Message,_std::default_delete<helics::Message>,_true,_true>)this;
}

Assistant:

std::unique_ptr<Message> MessageConditionalOperator::process(std::unique_ptr<Message> message)
{
    if (evalFunction) {
        if (evalFunction(message.get())) {
            return message;
        }
        return nullptr;
    }
    return message;
}